

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O2

void __thiscall
wasm::OptimizeInstructions::optimizeAddedConstants(wasm::Binary*)::ZeroRemover::visitBinary(wasm::
Binary__(void *this,Binary *curr)

{
  BinaryOp BVar1;
  Type type;
  bool bVar2;
  BinaryOp BVar3;
  Index IVar4;
  Expression *pEVar5;
  Walker<ZeroRemover,_wasm::Visitor<ZeroRemover,_void>_> *pWVar6;
  Expression *expr;
  EffectAnalyzer local_1a8;
  Walker<ZeroRemover,_wasm::Visitor<ZeroRemover,_void>_> *local_38;
  
  type.id = (curr->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id;
  if ((type.id & 0xfffffffffffffffe) != 2) {
    return;
  }
  pEVar5 = curr->left;
  if (curr->left->_id != ConstId) {
    pEVar5 = (Expression *)0x0;
  }
  expr = (Expression *)0x0;
  if (curr->right->_id == ConstId) {
    expr = curr->right;
  }
  BVar1 = curr->op;
  local_38 = (Walker<ZeroRemover,_wasm::Visitor<ZeroRemover,_void>_> *)this;
  BVar3 = Abstract::getBinary(type,Add);
  if (BVar1 == BVar3) {
    if ((pEVar5 == (Expression *)0x0) || (bVar2 = Literal::isZero((Literal *)(pEVar5 + 1)), !bVar2))
    {
      pWVar6 = local_38;
      if (expr == (Expression *)0x0) {
        return;
      }
      bVar2 = Literal::isZero((Literal *)(expr + 1));
      if (!bVar2) {
        return;
      }
      pEVar5 = curr->left;
    }
    else {
      pEVar5 = curr->right;
      pWVar6 = local_38;
    }
    Walker<ZeroRemover,_wasm::Visitor<ZeroRemover,_void>_>::replaceCurrent(pWVar6,pEVar5);
    return;
  }
  BVar1 = curr->op;
  BVar3 = Abstract::getBinary(type,Shl);
  pWVar6 = local_38;
  if (BVar1 == BVar3) {
    if ((pEVar5 == (Expression *)0x0) || (bVar2 = Literal::isZero((Literal *)(pEVar5 + 1)), !bVar2))
    {
      if (expr == (Expression *)0x0) {
        return;
      }
      IVar4 = Bits::getEffectiveShifts(expr);
      if (IVar4 != 0) {
        return;
      }
    }
    EffectAnalyzer::EffectAnalyzer
              (&local_1a8,(PassOptions *)pWVar6[1].replacep,pWVar6->currModule,curr->right);
    bVar2 = EffectAnalyzer::hasSideEffects(&local_1a8);
    EffectAnalyzer::~EffectAnalyzer(&local_1a8);
    if (bVar2) {
      return;
    }
    pEVar5 = curr->left;
  }
  else {
    BVar1 = curr->op;
    BVar3 = Abstract::getBinary(type,Mul);
    pWVar6 = local_38;
    if (BVar1 != BVar3) {
      return;
    }
    if ((pEVar5 != (Expression *)0x0) && (bVar2 = Literal::isZero((Literal *)(pEVar5 + 1)), bVar2))
    {
      EffectAnalyzer::EffectAnalyzer
                (&local_1a8,(PassOptions *)pWVar6[1].replacep,pWVar6->currModule,curr->right);
      bVar2 = EffectAnalyzer::hasSideEffects(&local_1a8);
      EffectAnalyzer::~EffectAnalyzer(&local_1a8);
      if (!bVar2) goto LAB_008f8101;
    }
    if (expr == (Expression *)0x0) {
      return;
    }
    bVar2 = Literal::isZero((Literal *)(expr + 1));
    if (!bVar2) {
      return;
    }
    EffectAnalyzer::EffectAnalyzer
              (&local_1a8,(PassOptions *)pWVar6[1].replacep,pWVar6->currModule,curr->left);
    bVar2 = EffectAnalyzer::hasSideEffects(&local_1a8);
    EffectAnalyzer::~EffectAnalyzer(&local_1a8);
    pEVar5 = expr;
    if (bVar2) {
      return;
    }
  }
LAB_008f8101:
  Walker<ZeroRemover,_wasm::Visitor<ZeroRemover,_void>_>::replaceCurrent(pWVar6,pEVar5);
  return;
}

Assistant:

void visitBinary(Binary* curr) {
        if (!curr->type.isInteger()) {
          return;
        }
        auto type = curr->type;
        auto* left = curr->left->dynCast<Const>();
        auto* right = curr->right->dynCast<Const>();
        // Canonicalization prefers an add instead of a subtract wherever
        // possible. That prevents a subtracted constant on the right,
        // as it would be added. And for a zero on the left, it can't be
        // removed (it is how we negate ints).
        if (curr->op == Abstract::getBinary(type, Abstract::Add)) {
          if (left && left->value.isZero()) {
            replaceCurrent(curr->right);
            return;
          }
          if (right && right->value.isZero()) {
            replaceCurrent(curr->left);
            return;
          }
        } else if (curr->op == Abstract::getBinary(type, Abstract::Shl)) {
          // shifting a 0 is a 0, or anything by 0 has no effect, all unless the
          // shift has side effects
          if (((left && left->value.isZero()) ||
               (right && Bits::getEffectiveShifts(right) == 0)) &&
              !EffectAnalyzer(passOptions, *getModule(), curr->right)
                 .hasSideEffects()) {
            replaceCurrent(curr->left);
            return;
          }
        } else if (curr->op == Abstract::getBinary(type, Abstract::Mul)) {
          // multiplying by zero is a zero, unless the other side has side
          // effects
          if (left && left->value.isZero() &&
              !EffectAnalyzer(passOptions, *getModule(), curr->right)
                 .hasSideEffects()) {
            replaceCurrent(left);
            return;
          }
          if (right && right->value.isZero() &&
              !EffectAnalyzer(passOptions, *getModule(), curr->left)
                 .hasSideEffects()) {
            replaceCurrent(right);
            return;
          }
        }
      }